

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxUnicode.cpp
# Opt level: O1

void Jinx::Impl::ConvertUtf32ToUtf8
               (char32_t utf32CodePoint,char *utf8Out,size_t outBufferCount,size_t *numCharsOut)

{
  char *format;
  byte bVar1;
  
  if ((outBufferCount != 0 && utf8Out != (char *)0x0) && numCharsOut != (size_t *)0x0) {
    *numCharsOut = 1;
    bVar1 = (byte)utf32CodePoint;
    if ((uint)utf32CodePoint < 0x80) {
      *utf8Out = bVar1;
      *numCharsOut = 1;
      return;
    }
    if ((uint)utf32CodePoint < 0x800) {
      if (1 < outBufferCount) {
        *utf8Out = (byte)((uint)utf32CodePoint >> 6) | 0xc0;
        utf8Out[1] = bVar1 & 0x3f | 0x80;
        *numCharsOut = 2;
        return;
      }
    }
    else if ((uint)utf32CodePoint < 0x10000) {
      if (2 < outBufferCount) {
        *utf8Out = (byte)((uint)utf32CodePoint >> 0xc) | 0xe0;
        utf8Out[1] = (byte)((uint)utf32CodePoint >> 6) & 0x3f | 0x80;
        utf8Out[2] = bVar1 & 0x3f | 0x80;
        *numCharsOut = 3;
        return;
      }
    }
    else {
      if (0x10ffff < (uint)utf32CodePoint) {
        format = "Invalid character data passed to function ConvertUtf32ToUtf8()";
        goto LAB_00111ea8;
      }
      if (3 < outBufferCount) {
        *utf8Out = (byte)((uint)utf32CodePoint >> 0x12) | 0xf0;
        utf8Out[1] = (byte)((uint)utf32CodePoint >> 0xc) & 0x3f | 0x80;
        utf8Out[2] = (byte)((uint)utf32CodePoint >> 6) & 0x3f | 0x80;
        utf8Out[3] = bVar1 & 0x3f | 0x80;
        *numCharsOut = 4;
        return;
      }
    }
  }
  format = "Invalid arguments passed to ConvertUtf32ToUtf8()";
LAB_00111ea8:
  LogWriteLine(Error,format);
  return;
}

Assistant:

inline_t void ConvertUtf32ToUtf8(char32_t utf32CodePoint, char * utf8Out, size_t outBufferCount, size_t * numCharsOut)
	{
		// Validate parameters
		if (!utf8Out || outBufferCount == 0 || !numCharsOut)
		{
			LogWriteLine(LogLevel::Error, "Invalid arguments passed to ConvertUtf32ToUtf8()");
			return;
		}

		// Initialize output
		*numCharsOut = 1;

		// Check for all four conversion cases
		if (utf32CodePoint < 0x80)
		{
			utf8Out[0] = char(utf32CodePoint & 0x7F);
			*numCharsOut = 1;
		}
		else if (utf32CodePoint < 0x0800)
		{
			if (outBufferCount < 2)
			{
				LogWriteLine(LogLevel::Error, "Invalid arguments passed to ConvertUtf32ToUtf8()");
				return;
			}
			utf8Out[0] = uint8_t(utf32CodePoint >> 6) | 0xC0;
			utf8Out[1] = (uint8_t(utf32CodePoint >> 0) & 0x3F) | 0x80;
			*numCharsOut = 2;
		}
		else if (utf32CodePoint < 0x010000)
		{
			if (outBufferCount < 3)
			{
				LogWriteLine(LogLevel::Error, "Invalid arguments passed to ConvertUtf32ToUtf8()");
				return;
			}
			utf8Out[0] = (uint8_t(utf32CodePoint >> 12) & 0x0F) | 0xE0;
			utf8Out[1] = (uint8_t(utf32CodePoint >> 6) & 0x3F) | 0x80;
			utf8Out[2] = (uint8_t(utf32CodePoint >> 0) & 0x3F) | 0x80;
			*numCharsOut = 3;
		}
		else if (utf32CodePoint < 0x110000)
		{
			if (outBufferCount < 4)
			{
				LogWriteLine(LogLevel::Error, "Invalid arguments passed to ConvertUtf32ToUtf8()");
				return;
			}
			utf8Out[0] = (uint8_t(utf32CodePoint >> 18) & 0x07) | 0xF0;
			utf8Out[1] = (uint8_t(utf32CodePoint >> 12) & 0x3F) | 0x80;
			utf8Out[2] = (uint8_t(utf32CodePoint >> 6) & 0x3F) | 0x80;
			utf8Out[3] = (uint8_t(utf32CodePoint >> 0) & 0x3F) | 0x80;
			*numCharsOut = 4;
		}
		else
		{
			// Invalid data
			LogWriteLine(LogLevel::Error, "Invalid character data passed to function ConvertUtf32ToUtf8()");
		}
	}